

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O3

StatementBlockKind slang::ast::SemanticFacts::getStatementBlockKind(BlockStatementSyntax *syntax)

{
  TokenKind TVar1;
  StatementBlockKind SVar2;
  
  SVar2 = Sequential;
  if ((syntax->super_StatementSyntax).super_SyntaxNode.kind != SequentialBlockStatement) {
    TVar1 = (syntax->end).kind;
    SVar2 = JoinAny;
    if (TVar1 != JoinAnyKeyword) {
      SVar2 = (uint)(TVar1 == JoinNoneKeyword) * 2 + JoinAll;
    }
  }
  return SVar2;
}

Assistant:

StatementBlockKind SemanticFacts::getStatementBlockKind(const BlockStatementSyntax& syntax) {
    if (syntax.kind == SyntaxKind::SequentialBlockStatement)
        return StatementBlockKind::Sequential;

    SLANG_ASSERT(syntax.kind == SyntaxKind::ParallelBlockStatement);
    switch (syntax.end.kind) {
        case TokenKind::JoinAnyKeyword:
            return StatementBlockKind::JoinAny;
        case TokenKind::JoinNoneKeyword:
            return StatementBlockKind::JoinNone;
        default:
            return StatementBlockKind::JoinAll;
    }
}